

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_reader_init_data(mpack_reader_t *reader,char *data,size_t count)

{
  reader->size = 0;
  reader->data = (char *)0x0;
  reader->end = (char *)0x0;
  *(undefined8 *)&reader->error = 0;
  reader->skip = (mpack_reader_skip_t)0x0;
  reader->buffer = (char *)0x0;
  reader->error_fn = (mpack_reader_error_t)0x0;
  reader->teardown = (mpack_reader_teardown_t)0x0;
  reader->context = (void *)0x0;
  reader->fill = (mpack_reader_fill_t)0x0;
  reader->data = data;
  reader->end = data + count;
  return;
}

Assistant:

void mpack_reader_init_data(mpack_reader_t* reader, const char* data, size_t count) {
    mpack_assert(data != NULL, "data is NULL");

    mpack_memset(reader, 0, sizeof(*reader));
    reader->data = data;
    reader->end = data + count;

    #if MPACK_READ_TRACKING
    mpack_reader_flag_if_error(reader, mpack_track_init(&reader->track));
    #endif

    mpack_log("===========================\n");
    mpack_log("initializing reader with data size %i\n", (int)count);
}